

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O0

void __thiscall
Transaction_AddScriptWitnessStack_SetScriptWitnessStack_RemoveScriptWitnessStackAll_Test::TestBody
          (Transaction_AddScriptWitnessStack_SetScriptWitnessStack_RemoveScriptWitnessStackAll_Test
           *this)

{
  bool bVar1;
  char *pcVar2;
  const_reference pvVar3;
  AssertHelper local_c20;
  Message local_c18;
  int local_c10;
  uint32_t local_c0c;
  undefined1 local_c08 [8];
  AssertionResult gtest_ar_10;
  Message local_bf0;
  AssertHelper local_be8;
  Message local_be0;
  int local_bd8;
  uint32_t local_bd4;
  undefined1 local_bd0 [8];
  AssertionResult gtest_ar_9;
  Message local_bb8 [2];
  CfdException *anon_var_0_3;
  char *pcStack_ba0;
  bool gtest_caught_expected_3;
  ConstCharPtr gtest_msg_3;
  Message local_b90;
  int local_b88;
  uint32_t local_b84;
  undefined1 local_b80 [8];
  AssertionResult gtest_ar_8;
  Message local_b68;
  AbstractTxInReference local_b60;
  ScriptWitness local_ad0;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_ab0;
  string local_a98;
  undefined1 local_a78 [8];
  AssertionResult gtest_ar_7;
  Message local_a60;
  AbstractTxInReference local_a58;
  ScriptWitness local_9c8;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_9a8;
  string local_990;
  undefined1 local_970 [8];
  AssertionResult gtest_ar_6;
  Message local_958;
  AbstractTxInReference local_950;
  ScriptWitness local_8c0;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_8a0;
  string local_888;
  undefined1 local_868 [8];
  AssertionResult gtest_ar_5;
  Message local_850;
  int local_848;
  uint32_t local_844;
  undefined1 local_840 [8];
  AssertionResult gtest_ar_4;
  Message local_828 [2];
  CfdException *anon_var_0_2;
  string local_810;
  ByteData local_7f0;
  ScriptWitness local_7d8;
  byte local_7b1;
  char *pcStack_7b0;
  bool gtest_caught_expected_2;
  ConstCharPtr gtest_msg_2;
  Message local_7a0 [2];
  CfdException *anon_var_0_1;
  string local_788;
  ByteData local_768;
  ScriptWitness local_750;
  byte local_729;
  char *pcStack_728;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  Message local_718;
  allocator local_709;
  string local_708;
  ByteData256 local_6e8;
  ScriptWitness local_6d0;
  AssertHelper local_6b0;
  Message local_6a8;
  allocator local_699;
  string local_698;
  ByteData160 local_678;
  ScriptWitness local_660;
  AssertHelper local_640;
  Message local_638;
  allocator local_629;
  string local_628;
  ByteData local_608;
  ScriptWitness local_5f0;
  AssertHelper local_5d0;
  Message local_5c8;
  AbstractTxInReference local_5c0;
  ScriptWitness local_530;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_510;
  string local_4f8;
  undefined1 local_4d8 [8];
  AssertionResult gtest_ar_3;
  Message local_4c0;
  AbstractTxInReference local_4b8;
  ScriptWitness local_428;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_408;
  string local_3f0;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar_2;
  Message local_3b8;
  AbstractTxInReference local_3b0;
  ScriptWitness local_320;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_300;
  string local_2e8;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar_1;
  Message local_2b0;
  int local_2a8;
  uint32_t local_2a4;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar;
  Message local_288 [2];
  CfdException *anon_var_0;
  string local_270;
  ByteData local_250;
  ScriptWitness local_238;
  byte local_211;
  char *pcStack_210;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Message local_200;
  allocator local_1f1;
  string local_1f0;
  ByteData256 local_1d0;
  ScriptWitness local_1b8;
  AssertHelper local_198;
  Message local_190;
  allocator local_181;
  string local_180;
  ByteData160 local_160;
  ScriptWitness local_148;
  AssertHelper local_128;
  Message local_120;
  allocator local_111;
  string local_110;
  ByteData local_f0;
  ScriptWitness local_d8;
  AssertHelper local_b8;
  Message local_b0;
  allocator local_a1;
  string local_a0;
  Txid local_80;
  undefined1 local_50 [8];
  Transaction tx;
  Transaction_AddScriptWitnessStack_SetScriptWitnessStack_RemoveScriptWitnessStackAll_Test
  *this_local;
  
  tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  cfd::core::Transaction::Transaction((Transaction *)local_50,2,0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_a0,
                 "d4470b3c4b616042e5004b1ab60cb1734d21b8e1c4854c379ec8c3f7ca1e450f",&local_a1);
      cfd::core::Txid::Txid(&local_80,&local_a0);
      cfd::core::Transaction::AddTxIn
                ((Transaction *)local_50,&local_80,0,0xfffffffe,(Script *)cfd::core::Script::Empty);
      cfd::core::Txid::~Txid(&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    }
  }
  else {
    testing::Message::Message(&local_b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x13e,
               "Expected: tx.AddTxIn( Txid( \"d4470b3c4b616042e5004b1ab60cb1734d21b8e1c4854c379ec8c3f7ca1e450f\"), 0, 4294967294) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::Message::~Message(&local_b0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_110,"1122334455667788",&local_111);
      cfd::core::ByteData::ByteData(&local_f0,&local_110);
      cfd::core::Transaction::AddScriptWitnessStack(&local_d8,(Transaction *)local_50,0,&local_f0);
      cfd::core::ScriptWitness::~ScriptWitness(&local_d8);
      cfd::core::ByteData::~ByteData(&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
    }
  }
  else {
    testing::Message::Message(&local_120);
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x141,
               "Expected: tx.AddScriptWitnessStack(0, ByteData(\"1122334455667788\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_128,&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    testing::Message::~Message(&local_120);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_180,"1122334455667788990011223344556677889900",&local_181);
      cfd::core::ByteData160::ByteData160(&local_160,&local_180);
      cfd::core::Transaction::AddScriptWitnessStack(&local_148,(Transaction *)local_50,0,&local_160)
      ;
      cfd::core::ScriptWitness::~ScriptWitness(&local_148);
      cfd::core::ByteData160::~ByteData160(&local_160);
      std::__cxx11::string::~string((string *)&local_180);
      std::allocator<char>::~allocator((allocator<char> *)&local_181);
    }
  }
  else {
    testing::Message::Message(&local_190);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x144,
               "Expected: tx.AddScriptWitnessStack( 0, ByteData160(\"1122334455667788990011223344556677889900\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_198,&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    testing::Message::~Message(&local_190);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1f0,
                 "90a56135d400c93950da221773a0b6e1fe06c37482945ee97e4c92f7017aa385",&local_1f1);
      cfd::core::ByteData256::ByteData256(&local_1d0,&local_1f0);
      cfd::core::Transaction::AddScriptWitnessStack(&local_1b8,(Transaction *)local_50,0,&local_1d0)
      ;
      cfd::core::ScriptWitness::~ScriptWitness(&local_1b8);
      cfd::core::ByteData256::~ByteData256(&local_1d0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
    }
  }
  else {
    testing::Message::Message(&local_200);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x149,
               "Expected: tx.AddScriptWitnessStack( 0, ByteData256( \"90a56135d400c93950da221773a0b6e1fe06c37482945ee97e4c92f7017aa385\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg,&local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg);
    testing::Message::~Message(&local_200);
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffdf0,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffdf0);
  if (bVar1) {
    local_211 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_270,"aaaa",(allocator *)((long)&anon_var_0 + 7))
      ;
      cfd::core::ByteData::ByteData(&local_250,&local_270);
      cfd::core::Transaction::AddScriptWitnessStack(&local_238,(Transaction *)local_50,3,&local_250)
      ;
      cfd::core::ScriptWitness::~ScriptWitness(&local_238);
      cfd::core::ByteData::~ByteData(&local_250);
      std::__cxx11::string::~string((string *)&local_270);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
    }
    if ((local_211 & 1) == 0) {
      pcStack_210 = 
      "Expected: tx.AddScriptWitnessStack(3, ByteData(\"aaaa\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_002add9c;
    }
  }
  else {
LAB_002add9c:
    testing::Message::Message(local_288);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x14a,pcStack_210);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_288);
  }
  local_2a4 = cfd::core::Transaction::GetScriptWitnessStackNum((Transaction *)local_50,0);
  local_2a8 = 3;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_2a0,"tx.GetScriptWitnessStackNum(0)","3",&local_2a4,&local_2a8
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x14c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  cfd::core::Transaction::GetTxIn((TxInReference *)&local_3b0,(Transaction *)local_50,0);
  cfd::core::AbstractTxInReference::GetScriptWitness(&local_320,&local_3b0);
  cfd::core::ScriptWitness::GetWitness(&local_300,&local_320);
  pvVar3 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                     (&local_300,0);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_2e8,pvVar3);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2c8,
             "tx.GetTxIn(0).GetScriptWitness().GetWitness()[0].GetHex().c_str()",
             "\"1122334455667788\"",pcVar2,"1122334455667788");
  std::__cxx11::string::~string((string *)&local_2e8);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_300);
  cfd::core::ScriptWitness::~ScriptWitness(&local_320);
  cfd::core::TxInReference::~TxInReference((TxInReference *)&local_3b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  if (!bVar1) {
    testing::Message::Message(&local_3b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x14f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_3b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_3b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  cfd::core::Transaction::GetTxIn((TxInReference *)&local_4b8,(Transaction *)local_50,0);
  cfd::core::AbstractTxInReference::GetScriptWitness(&local_428,&local_4b8);
  cfd::core::ScriptWitness::GetWitness(&local_408,&local_428);
  pvVar3 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                     (&local_408,1);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_3f0,pvVar3);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_3d0,
             "tx.GetTxIn(0).GetScriptWitness().GetWitness()[1].GetHex().c_str()",
             "\"1122334455667788990011223344556677889900\"",pcVar2,
             "1122334455667788990011223344556677889900");
  std::__cxx11::string::~string((string *)&local_3f0);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_408);
  cfd::core::ScriptWitness::~ScriptWitness(&local_428);
  cfd::core::TxInReference::~TxInReference((TxInReference *)&local_4b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
  if (!bVar1) {
    testing::Message::Message(&local_4c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x152,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_4c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_4c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
  cfd::core::Transaction::GetTxIn((TxInReference *)&local_5c0,(Transaction *)local_50,0);
  cfd::core::AbstractTxInReference::GetScriptWitness(&local_530,&local_5c0);
  cfd::core::ScriptWitness::GetWitness(&local_510,&local_530);
  pvVar3 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                     (&local_510,2);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_4f8,pvVar3);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_4d8,
             "tx.GetTxIn(0).GetScriptWitness().GetWitness()[2].GetHex().c_str()",
             "\"90a56135d400c93950da221773a0b6e1fe06c37482945ee97e4c92f7017aa385\"",pcVar2,
             "90a56135d400c93950da221773a0b6e1fe06c37482945ee97e4c92f7017aa385");
  std::__cxx11::string::~string((string *)&local_4f8);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_510);
  cfd::core::ScriptWitness::~ScriptWitness(&local_530);
  cfd::core::TxInReference::~TxInReference((TxInReference *)&local_5c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d8);
  if (!bVar1) {
    testing::Message::Message(&local_5c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_5d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x155,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5d0,&local_5c8);
    testing::internal::AssertHelper::~AssertHelper(&local_5d0);
    testing::Message::~Message(&local_5c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_628,"ffff",&local_629);
      cfd::core::ByteData::ByteData(&local_608,&local_628);
      cfd::core::Transaction::SetScriptWitnessStack
                (&local_5f0,(Transaction *)local_50,0,0,&local_608);
      cfd::core::ScriptWitness::~ScriptWitness(&local_5f0);
      cfd::core::ByteData::~ByteData(&local_608);
      std::__cxx11::string::~string((string *)&local_628);
      std::allocator<char>::~allocator((allocator<char> *)&local_629);
    }
  }
  else {
    testing::Message::Message(&local_638);
    testing::internal::AssertHelper::AssertHelper
              (&local_640,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x158,
               "Expected: tx.SetScriptWitnessStack(0, 0, ByteData(\"ffff\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_640,&local_638);
    testing::internal::AssertHelper::~AssertHelper(&local_640);
    testing::Message::~Message(&local_638);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_698,"1111222233334444555566667777888899990000",&local_699);
      cfd::core::ByteData160::ByteData160(&local_678,&local_698);
      cfd::core::Transaction::SetScriptWitnessStack
                (&local_660,(Transaction *)local_50,0,1,&local_678);
      cfd::core::ScriptWitness::~ScriptWitness(&local_660);
      cfd::core::ByteData160::~ByteData160(&local_678);
      std::__cxx11::string::~string((string *)&local_698);
      std::allocator<char>::~allocator((allocator<char> *)&local_699);
    }
  }
  else {
    testing::Message::Message(&local_6a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_6b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x15b,
               "Expected: tx.SetScriptWitnessStack( 0, 1, ByteData160(\"1111222233334444555566667777888899990000\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_6b0,&local_6a8);
    testing::internal::AssertHelper::~AssertHelper(&local_6b0);
    testing::Message::~Message(&local_6a8);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_708,
                 "1111222233334444555566667777888899990000111122223333444455556666",&local_709);
      cfd::core::ByteData256::ByteData256(&local_6e8,&local_708);
      cfd::core::Transaction::SetScriptWitnessStack
                (&local_6d0,(Transaction *)local_50,0,2,&local_6e8);
      cfd::core::ScriptWitness::~ScriptWitness(&local_6d0);
      cfd::core::ByteData256::~ByteData256(&local_6e8);
      std::__cxx11::string::~string((string *)&local_708);
      std::allocator<char>::~allocator((allocator<char> *)&local_709);
    }
  }
  else {
    testing::Message::Message(&local_718);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x161,
               "Expected: tx.SetScriptWitnessStack( 0, 2, ByteData256( \"1111222233334444555566667777888899990000111122223333444455556666\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_1,&local_718);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_1);
    testing::Message::~Message(&local_718);
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff8d8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff8d8);
  if (bVar1) {
    local_729 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_788,"aaaa",(allocator *)((long)&anon_var_0_1 + 7));
      cfd::core::ByteData::ByteData(&local_768,&local_788);
      cfd::core::Transaction::SetScriptWitnessStack
                (&local_750,(Transaction *)local_50,2,0,&local_768);
      cfd::core::ScriptWitness::~ScriptWitness(&local_750);
      cfd::core::ByteData::~ByteData(&local_768);
      std::__cxx11::string::~string((string *)&local_788);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0_1 + 7));
    }
    if ((local_729 & 1) == 0) {
      pcStack_728 = 
      "Expected: tx.SetScriptWitnessStack(2, 0, ByteData(\"aaaa\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_002aed9b;
    }
  }
  else {
LAB_002aed9b:
    testing::Message::Message(local_7a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x162,pcStack_728);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_2,local_7a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_2);
    testing::Message::~Message(local_7a0);
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff850,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff850);
  if (bVar1) {
    local_7b1 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_810,"bbbb",(allocator *)((long)&anon_var_0_2 + 7));
      cfd::core::ByteData::ByteData(&local_7f0,&local_810);
      cfd::core::Transaction::SetScriptWitnessStack
                (&local_7d8,(Transaction *)local_50,0,4,&local_7f0);
      cfd::core::ScriptWitness::~ScriptWitness(&local_7d8);
      cfd::core::ByteData::~ByteData(&local_7f0);
      std::__cxx11::string::~string((string *)&local_810);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0_2 + 7));
    }
    if ((local_7b1 & 1) == 0) {
      pcStack_7b0 = 
      "Expected: tx.SetScriptWitnessStack(0, 4, ByteData(\"bbbb\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_002aeffb;
    }
  }
  else {
LAB_002aeffb:
    testing::Message::Message(local_828);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x163,pcStack_7b0);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_828);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(local_828);
  }
  local_844 = cfd::core::Transaction::GetScriptWitnessStackNum((Transaction *)local_50,0);
  local_848 = 3;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_840,"tx.GetScriptWitnessStackNum(0)","3",&local_844,&local_848
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_840);
  if (!bVar1) {
    testing::Message::Message(&local_850);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_840);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x165,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_850);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_850);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_840);
  cfd::core::Transaction::GetTxIn((TxInReference *)&local_950,(Transaction *)local_50,0);
  cfd::core::AbstractTxInReference::GetScriptWitness(&local_8c0,&local_950);
  cfd::core::ScriptWitness::GetWitness(&local_8a0,&local_8c0);
  pvVar3 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                     (&local_8a0,0);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_888,pvVar3);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_868,
             "tx.GetTxIn(0).GetScriptWitness().GetWitness()[0].GetHex().c_str()","\"ffff\"",pcVar2,
             "ffff");
  std::__cxx11::string::~string((string *)&local_888);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_8a0);
  cfd::core::ScriptWitness::~ScriptWitness(&local_8c0);
  cfd::core::TxInReference::~TxInReference((TxInReference *)&local_950);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_868);
  if (!bVar1) {
    testing::Message::Message(&local_958);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_868);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x168,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_958);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_958);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_868);
  cfd::core::Transaction::GetTxIn((TxInReference *)&local_a58,(Transaction *)local_50,0);
  cfd::core::AbstractTxInReference::GetScriptWitness(&local_9c8,&local_a58);
  cfd::core::ScriptWitness::GetWitness(&local_9a8,&local_9c8);
  pvVar3 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                     (&local_9a8,1);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_990,pvVar3);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_970,
             "tx.GetTxIn(0).GetScriptWitness().GetWitness()[1].GetHex().c_str()",
             "\"1111222233334444555566667777888899990000\"",pcVar2,
             "1111222233334444555566667777888899990000");
  std::__cxx11::string::~string((string *)&local_990);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_9a8);
  cfd::core::ScriptWitness::~ScriptWitness(&local_9c8);
  cfd::core::TxInReference::~TxInReference((TxInReference *)&local_a58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_970);
  if (!bVar1) {
    testing::Message::Message(&local_a60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_970);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x16b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_a60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_a60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_970);
  cfd::core::Transaction::GetTxIn((TxInReference *)&local_b60,(Transaction *)local_50,0);
  cfd::core::AbstractTxInReference::GetScriptWitness(&local_ad0,&local_b60);
  cfd::core::ScriptWitness::GetWitness(&local_ab0,&local_ad0);
  pvVar3 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                     (&local_ab0,2);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_a98,pvVar3);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_a78,
             "tx.GetTxIn(0).GetScriptWitness().GetWitness()[2].GetHex().c_str()",
             "\"1111222233334444555566667777888899990000111122223333444455556666\"",pcVar2,
             "1111222233334444555566667777888899990000111122223333444455556666");
  std::__cxx11::string::~string((string *)&local_a98);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_ab0);
  cfd::core::ScriptWitness::~ScriptWitness(&local_ad0);
  cfd::core::TxInReference::~TxInReference((TxInReference *)&local_b60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a78);
  if (!bVar1) {
    testing::Message::Message(&local_b68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x16e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_b68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_b68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a78);
  local_b84 = cfd::core::Transaction::GetScriptWitnessStackNum((Transaction *)local_50,0);
  local_b88 = 3;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_b80,"tx.GetScriptWitnessStackNum(0)","3",&local_b84,&local_b88
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b80);
  if (!bVar1) {
    testing::Message::Message(&local_b90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x171,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_3,&local_b90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_3);
    testing::Message::~Message(&local_b90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b80);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff460,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff460);
  if (bVar1) {
    anon_var_0_3._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::RemoveScriptWitnessStackAll((Transaction *)local_50,3);
    }
    if ((anon_var_0_3._7_1_ & 1) != 0) goto LAB_002afb5f;
    pcStack_ba0 = 
    "Expected: tx.RemoveScriptWitnessStackAll(3) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_bb8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
             ,0x172,pcStack_ba0);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,local_bb8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
  testing::Message::~Message(local_bb8);
LAB_002afb5f:
  local_bd4 = cfd::core::Transaction::GetScriptWitnessStackNum((Transaction *)local_50,0);
  local_bd8 = 3;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_bd0,"tx.GetScriptWitnessStackNum(0)","3",&local_bd4,&local_bd8
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bd0);
  if (!bVar1) {
    testing::Message::Message(&local_be0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_bd0);
    testing::internal::AssertHelper::AssertHelper
              (&local_be8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x173,pcVar2);
    testing::internal::AssertHelper::operator=(&local_be8,&local_be0);
    testing::internal::AssertHelper::~AssertHelper(&local_be8);
    testing::Message::~Message(&local_be0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bd0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::RemoveScriptWitnessStackAll((Transaction *)local_50,0);
    }
  }
  else {
    testing::Message::Message(&local_bf0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x175,
               "Expected: tx.RemoveScriptWitnessStackAll(0) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_bf0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_bf0);
  }
  local_c0c = cfd::core::Transaction::GetScriptWitnessStackNum((Transaction *)local_50,0);
  local_c10 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_c08,"tx.GetScriptWitnessStackNum(0)","0",&local_c0c,&local_c10
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c08);
  if (!bVar1) {
    testing::Message::Message(&local_c18);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c08);
    testing::internal::AssertHelper::AssertHelper
              (&local_c20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x176,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c20,&local_c18);
    testing::internal::AssertHelper::~AssertHelper(&local_c20);
    testing::Message::~Message(&local_c18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c08);
  cfd::core::Transaction::~Transaction((Transaction *)local_50);
  return;
}

Assistant:

TEST(Transaction, AddScriptWitnessStack_SetScriptWitnessStack_RemoveScriptWitnessStackAll) {
  Transaction tx(exp_version, exp_locktime);
  EXPECT_NO_THROW(
      tx.AddTxIn(
          Txid(
              "d4470b3c4b616042e5004b1ab60cb1734d21b8e1c4854c379ec8c3f7ca1e450f"),
          0, 4294967294));

  // AddScriptWitnessStack
  EXPECT_NO_THROW(tx.AddScriptWitnessStack(0, ByteData("1122334455667788")));
  EXPECT_NO_THROW(
      tx.AddScriptWitnessStack(
          0, ByteData160("1122334455667788990011223344556677889900")));
  EXPECT_NO_THROW(
      tx.AddScriptWitnessStack(
          0,
          ByteData256(
              "90a56135d400c93950da221773a0b6e1fe06c37482945ee97e4c92f7017aa385")));
  EXPECT_THROW(tx.AddScriptWitnessStack(3, ByteData("aaaa")), CfdException);

  EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 3);
  EXPECT_STREQ(
      tx.GetTxIn(0).GetScriptWitness().GetWitness()[0].GetHex().c_str(),
      "1122334455667788");
  EXPECT_STREQ(
      tx.GetTxIn(0).GetScriptWitness().GetWitness()[1].GetHex().c_str(),
      "1122334455667788990011223344556677889900");
  EXPECT_STREQ(
      tx.GetTxIn(0).GetScriptWitness().GetWitness()[2].GetHex().c_str(),
      "90a56135d400c93950da221773a0b6e1fe06c37482945ee97e4c92f7017aa385");

  // SetScriptWitnessStack
  EXPECT_NO_THROW(tx.SetScriptWitnessStack(0, 0, ByteData("ffff")));
  EXPECT_NO_THROW(
      tx.SetScriptWitnessStack(
          0, 1, ByteData160("1111222233334444555566667777888899990000")));
  EXPECT_NO_THROW(
      tx.SetScriptWitnessStack(
          0,
          2,
          ByteData256(
              "1111222233334444555566667777888899990000111122223333444455556666")));
  EXPECT_THROW(tx.SetScriptWitnessStack(2, 0, ByteData("aaaa")), CfdException);
  EXPECT_THROW(tx.SetScriptWitnessStack(0, 4, ByteData("bbbb")), CfdException);

  EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 3);
  EXPECT_STREQ(
      tx.GetTxIn(0).GetScriptWitness().GetWitness()[0].GetHex().c_str(),
      "ffff");
  EXPECT_STREQ(
      tx.GetTxIn(0).GetScriptWitness().GetWitness()[1].GetHex().c_str(),
      "1111222233334444555566667777888899990000");
  EXPECT_STREQ(
      tx.GetTxIn(0).GetScriptWitness().GetWitness()[2].GetHex().c_str(),
      "1111222233334444555566667777888899990000111122223333444455556666");

  // RemoveScriptWitnessStackAll
  EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 3);
  EXPECT_THROW(tx.RemoveScriptWitnessStackAll(3), CfdException);
  EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 3);

  EXPECT_NO_THROW(tx.RemoveScriptWitnessStackAll(0));
  EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 0);
}